

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

double __thiscall icu_63::CalendarAstronomer::getJulianCentury(CalendarAstronomer *this)

{
  UBool UVar1;
  double dVar2;
  CalendarAstronomer *this_local;
  
  UVar1 = isINVALID(this->julianCentury);
  if (UVar1 != '\0') {
    dVar2 = getJulianDay(this);
    this->julianCentury = (dVar2 - 2415020.0) / 36525.0;
  }
  return this->julianCentury;
}

Assistant:

double CalendarAstronomer::getJulianCentury() {
    if (isINVALID(julianCentury)) {
        julianCentury = (getJulianDay() - 2415020.0) / 36525.0;
    }
    return julianCentury;
}